

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationCreator.hpp
# Opt level: O3

void __thiscall
OpenMD::OptimizationBuilder<QuantLib::SteepestDescent>::~OptimizationBuilder
          (OptimizationBuilder<QuantLib::SteepestDescent> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_OptimizationCreator)._vptr_OptimizationCreator =
       (_func_int **)&PTR__OptimizationCreator_002fe948;
  pcVar2 = (this->super_OptimizationCreator).ident_._M_dataplus._M_p;
  paVar1 = &(this->super_OptimizationCreator).ident_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

OptimizationBuilder(const std::string& ident) :
        OptimizationCreator(ident) {}